

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.cc
# Opt level: O0

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::Point::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,Point *this,RefinementPattern *ref_pattern,dim_t codim)

{
  RefElType RVar1;
  RefElType RVar2;
  int iVar3;
  uint uVar4;
  runtime_error *prVar5;
  ostream *poVar6;
  undefined1 local_660 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_658;
  string local_650;
  allocator<char> local_629;
  string local_628;
  allocator<char> local_601;
  string local_600;
  stringstream local_5e0 [8];
  stringstream ss_2;
  ostream local_5d0 [376];
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  RefEl local_3e1;
  string local_3e0;
  stringstream local_3c0 [8];
  stringstream ss_1;
  ostream local_3b0 [381];
  RefEl local_233;
  RefEl local_232;
  undefined1 local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  dim_t local_24;
  RefinementPattern *pRStack_20;
  dim_t codim_local;
  RefinementPattern *ref_pattern_local;
  Point *this_local;
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  *child_geo_uptrs;
  
  local_24 = codim;
  pRStack_20 = ref_pattern;
  ref_pattern_local = (RefinementPattern *)this;
  this_local = (Point *)__return_storage_ptr__;
  if (codim != 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(local_1a0,"Only codim = 0 allowed for a point");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"codim == 0",&local_1e1)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/point.cc"
               ,&local_209);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e0,&local_208,0x20,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_231 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  ::vector(__return_storage_ptr__);
  local_232 = RefinementPattern::RefEl(pRStack_20);
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_232);
  local_233 = lf::base::RefEl::kPoint();
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_233);
  if (RVar1 != RVar2) {
    std::__cxx11::stringstream::stringstream(local_3c0);
    poVar6 = std::operator<<(local_3b0,"ref_patern.RefEl() = ");
    local_3e1 = RefinementPattern::RefEl(pRStack_20);
    lf::base::RefEl::ToString_abi_cxx11_(&local_3e0,&local_3e1);
    std::operator<<(poVar6,(string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"ref_pattern.RefEl() == lf::base::RefEl::kPoint()",&local_409);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/point.cc"
               ,&local_431);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_408,&local_430,0x23,&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = (**pRStack_20->_vptr_RefinementPattern)(pRStack_20,0);
  if (iVar3 == 1) {
    std::make_unique<lf::geometry::Point,Eigen::Matrix<double,_1,1,0,_1,1>const&>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_660);
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               &local_658,
               (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
               local_660);
    std::
    vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_658);
    std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
    ~unique_ptr(&local_658);
    std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
              ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
               local_660);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_5e0);
  poVar6 = std::operator<<(local_5d0,"ref_pattern.NumChildren() = ");
  uVar4 = (**pRStack_20->_vptr_RefinementPattern)(pRStack_20,0);
  std::ostream::operator<<(poVar6,uVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"ref_pattern.NumChildren(0) == 1",&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/point.cc"
             ,&local_629);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_600,&local_628,0x25,&local_650);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator(&local_629);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"this code should not be reached");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<std::unique_ptr<Geometry>> Point::ChildGeometry(
    const RefinementPattern& ref_pattern, lf::base::dim_t codim) const {
  LF_VERIFY_MSG(codim == 0, "Only codim = 0 allowed for a point");
  std::vector<std::unique_ptr<Geometry>> child_geo_uptrs{};
  LF_VERIFY_MSG(ref_pattern.RefEl() == lf::base::RefEl::kPoint(),
                "ref_patern.RefEl() = " << ref_pattern.RefEl().ToString());
  LF_VERIFY_MSG(ref_pattern.NumChildren(0) == 1,
                "ref_pattern.NumChildren() = " << ref_pattern.NumChildren(0));
  // The only way to "refine" a point is to copy it
  child_geo_uptrs.push_back(std::make_unique<Point>(coord_));
  return child_geo_uptrs;
}